

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::AsyncInputStream,_std::nullptr_t> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::getEntityBody
          (HttpInputStreamImpl *this,RequestOrResponse type,
          OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method,uint statusCode,HttpHeaders *headers)

{
  int iVar1;
  void *pvVar2;
  Exception *__nptr;
  HttpEntityBodyReader *this_00;
  _func_int **pp_Var3;
  ulonglong uVar4;
  HttpNullEntityReader *this_01;
  undefined4 in_register_0000000c;
  RequestOrResponse RVar5;
  AsyncInputStream *extraout_RDX;
  AsyncInputStream *extraout_RDX_00;
  AsyncInputStream *extraout_RDX_01;
  AsyncInputStream *extraout_RDX_02;
  AsyncInputStream *extraout_RDX_03;
  AsyncInputStream *extraout_RDX_04;
  AsyncInputStream *pAVar6;
  AsyncInputStream *extraout_RDX_05;
  RequestOrResponse *value;
  char (*params) [62];
  long lVar7;
  undefined4 in_register_00000034;
  HttpInputStreamImpl *params_00;
  long in_R9;
  bool bVar8;
  Own<kj::AsyncInputStream,_std::nullptr_t> OVar9;
  RequestOrResponse type_local;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f_2;
  Fault f;
  HttpNullEntityReader *local_b8;
  undefined1 local_b0 [16];
  char local_a0;
  Fault f_4;
  StringPtr local_78;
  Array<char> local_68;
  CappedArray<char,_14UL> local_48;
  
  params_00 = (HttpInputStreamImpl *)CONCAT44(in_register_00000034,type);
  RVar5 = (RequestOrResponse)method;
  _kjCondition.left = (params_00->headerBuffer).size_;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = _kjCondition.left != 0;
  type_local = RVar5;
  if (_kjCondition.left == 0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[52]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x854,FAILED,"headerBuffer.size() > 0",
               "_kjCondition,\"Cannot get entity body after header buffer release.\"",&_kjCondition,
               (char (*) [52])"Cannot get entity body after header buffer release.");
    kj::_::Debug::Fault::fatal(&f);
  }
  iVar1 = *(int *)CONCAT44(in_register_0000000c,statusCode);
  if (iVar1 == 1) {
    if (RVar5 != RESPONSE) goto LAB_00368eed;
    if (((int *)CONCAT44(in_register_0000000c,statusCode))[2] == 1) {
      lVar7 = *(long *)(in_R9 + 8);
      if (*(ulong *)(lVar7 + 0x58) < 2) {
        bVar8 = *(ulong *)(lVar7 + 0x68) < 2;
        uVar4 = 0;
      }
      else {
        uVar4 = strtoull(*(char **)(lVar7 + 0x50),(char **)0x0,10);
        bVar8 = true;
      }
      this_01 = (HttpNullEntityReader *)operator_new(0x28);
      _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,bVar8);
      if (bVar8 != false) {
        _kjCondition._8_8_ = uVar4;
      }
      HttpNullEntityReader::HttpNullEntityReader
                (this_01,params_00,(Maybe<unsigned_long> *)&_kjCondition);
      f.exception = (Exception *)
                    &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpNullEntityReader>::instance;
      (this->super_HttpInputStream)._vptr_HttpInputStream =
           (_func_int **)
           &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpNullEntityReader>::instance;
      (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
      currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)this_01;
      local_b8 = (HttpNullEntityReader *)0x0;
      Own<kj::(anonymous_namespace)::HttpNullEntityReader,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::HttpNullEntityReader,_std::nullptr_t> *)&f);
      pAVar6 = extraout_RDX_04;
      goto LAB_00369204;
    }
    bVar8 = false;
LAB_00368ebc:
    iVar1 = (int)headers;
    if (bVar8 && iVar1 - 200U < 100) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x86c,FAILED,(char *)0x0,
                 "\"a CONNECT response with a 2xx status does not have an entity body to get\"",
                 (char (*) [73])
                 "a CONNECT response with a 2xx status does not have an entity body to get");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    if ((iVar1 != 0x130) && (iVar1 != 0xcc)) goto LAB_00368eed;
LAB_003690ef:
    f.exception = (Exception *)0x0;
    heap<kj::(anonymous_namespace)::HttpNullEntityReader,kj::(anonymous_namespace)::HttpInputStreamImpl&,unsigned_long>
              ((kj *)&_kjCondition,params_00,(unsigned_long *)&f);
    (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)_kjCondition.left;
    (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
    currentWrapper.ptr =
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)_kjCondition._8_8_;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    Own<kj::(anonymous_namespace)::HttpNullEntityReader,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::HttpNullEntityReader,_std::nullptr_t> *)&_kjCondition
              );
    pAVar6 = extraout_RDX_01;
  }
  else {
    bVar8 = iVar1 == 2;
    if (RVar5 == RESPONSE) goto LAB_00368ebc;
LAB_00368eed:
    lVar7 = *(long *)(in_R9 + 8);
    pvVar2 = *(void **)(lVar7 + 0x68);
    if (pvVar2 < (void *)0x2) {
LAB_0036906c:
      if (*(char **)(lVar7 + 0x58) < (char *)0x2) {
        if (RVar5 != REQUEST) {
          if ((char *)0x1 < *(char **)(lVar7 + 0xe8)) {
            _kjCondition._8_8_ = *(undefined8 *)(lVar7 + 0xe0);
            _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,1);
            f.exception = (Exception *)anon_var_dwarf_a31c1e;
            local_b8 = (HttpNullEntityReader *)0x15;
            _kjCondition.op.content.ptr = *(char **)(lVar7 + 0xe8);
            bVar8 = StringPtr::startsWith((StringPtr *)&_kjCondition.right,(StringPtr *)&f);
            if (bVar8) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[141]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                         ,0x8ae,FAILED,(char *)0x0,
                         "\"refusing to handle multipart/byteranges response without transfer-encoding nor \" \"content-length due to ambiguity between RFC 2616 vs RFC 7230.\""
                         ,(char (*) [141])
                          "refusing to handle multipart/byteranges response without transfer-encoding nor content-length due to ambiguity between RFC 2616 vs RFC 7230."
                        );
              kj::_::Debug::Fault::fatal(&f);
            }
          }
          heap<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader,kj::(anonymous_namespace)::HttpInputStreamImpl&>
                    ((kj *)&_kjCondition,params_00);
          (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)_kjCondition.left;
          (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
          currentWrapper.ptr =
               (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)_kjCondition._8_8_;
          _kjCondition.right = 0;
          _kjCondition._12_4_ = 0;
          Own<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader,_std::nullptr_t>::~Own
                    ((Own<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader,_std::nullptr_t>
                      *)&_kjCondition);
          pAVar6 = extraout_RDX_00;
          goto LAB_00369204;
        }
        goto LAB_003690ef;
      }
      __nptr = *(Exception **)(lVar7 + 0x50);
      _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,1);
      _kjCondition._8_8_ = __nptr;
      _kjCondition.op.content.ptr = *(char **)(lVar7 + 0x58);
      pp_Var3 = (_func_int **)strtoull((char *)__nptr,(char **)&f,10);
      if ((f.exception <= __nptr) || (*(char *)&((f.exception)->ownFile).content.ptr != '\0')) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36],kj::StringPtr&>
                  (&f_4,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x89a,FAILED,(char *)0x0,"\"invalid Content-Length header value\", cl",
                   (char (*) [36])"invalid Content-Length header value",
                   (StringPtr *)&_kjCondition.right);
        kj::_::Debug::Fault::fatal(&f_4);
      }
      this_00 = (HttpEntityBodyReader *)operator_new(0x28);
      HttpEntityBodyReader::HttpEntityBodyReader(this_00,params_00);
      (this_00->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_0066cd58;
      this_00[1].super_AsyncInputStream._vptr_AsyncInputStream = pp_Var3;
      *(undefined1 *)&this_00[1].weakInner.ptr = 1;
      pAVar6 = extraout_RDX_02;
      if (pp_Var3 == (_func_int **)0x0) {
        HttpEntityBodyReader::doneReading(this_00);
        pAVar6 = extraout_RDX_03;
      }
      pp_Var3 = (_func_int **)
                &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpFixedLengthEntityReader>::
                 instance;
    }
    else {
      local_78.content.ptr = *(char **)(lVar7 + 0x60);
      local_78.content.size_ = (size_t)pvVar2;
      if ((*local_78.content.ptr & 0xdfU) == 0x49) {
        if ((((((((byte *)local_78.content.ptr)[1] & 0xdf) == 0x44) &&
              ((((byte *)local_78.content.ptr)[2] & 0xdf) == 0x45)) &&
             ((((byte *)local_78.content.ptr)[3] & 0xdf) == 0x4e)) &&
            (((((byte *)local_78.content.ptr)[4] & 0xdf) == 0x54 &&
             ((((byte *)local_78.content.ptr)[5] & 0xdf) == 0x49)))) &&
           (((((byte *)local_78.content.ptr)[6] & 0xdf) == 0x54 &&
            (((((byte *)local_78.content.ptr)[7] & 0xdf) == 0x59 &&
             (((byte *)local_78.content.ptr)[8] == 0)))))) {
          local_b8 = (HttpNullEntityReader *)((ulong)local_b8 & 0xffffffff00000000);
          f.exception = (Exception *)&type_local;
          local_b0._0_8_ = anon_var_dwarf_43885;
          local_b0._8_8_ = &DAT_00000005;
          local_a0 = RVar5 != REQUEST;
          if (RVar5 == REQUEST) {
            f_2.exception = (Exception *)0x0;
            kj::_::
            tryToCharSequence<kj::(anonymous_namespace)::HttpInputStreamImpl::RequestOrResponse,kj::CappedArray<char,14ul>>
                      ((CappedArray<char,_14UL> *)&f_4,(_ *)&type_local,(RequestOrResponse *)" > ");
            kj::_::
            tryToCharSequence<kj::(anonymous_namespace)::HttpInputStreamImpl::RequestOrResponse,kj::CappedArray<char,14ul>>
                      (&local_48,(_ *)&local_b8,value);
            kj::_::concat<kj::CappedArray<char,14ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
                      ((String *)&local_68,(_ *)&f_4,(CappedArray<char,_14UL> *)local_b0,
                       (StringPtr *)&local_48,(CappedArray<char,_14UL> *)headers);
            _kjCondition.left = (unsigned_long)local_68.ptr;
            _kjCondition._8_8_ = local_68.size_;
            _kjCondition.op.content.ptr = (char *)local_68.disposer;
            local_68.ptr = (char *)0x0;
            local_68.size_ = 0;
            Array<char>::~Array(&local_68);
            str<char_const(&)[62]>
                      ((String *)&_kjCondition.op.content.size_,
                       (kj *)"request body cannot have Transfer-Encoding other than chunked",params)
            ;
            f_4.exception = (Exception *)&_kjCondition;
            kj::_::Debug::Fault::init
                      (&f_2,(EVP_PKEY_CTX *)
                            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                      );
            lVar7 = 0x18;
            do {
              Array<char>::~Array((Array<char> *)((long)&_kjCondition.left + lVar7));
              lVar7 = lVar7 + -0x18;
            } while (lVar7 != -0x18);
            kj::_::Debug::Fault::fatal(&f_2);
          }
          heap<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader,kj::(anonymous_namespace)::HttpInputStreamImpl&>
                    ((kj *)&_kjCondition,params_00);
          (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)_kjCondition.left;
          (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
          currentWrapper.ptr =
               (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)_kjCondition._8_8_;
          _kjCondition.right = 0;
          _kjCondition._12_4_ = 0;
          Own<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader,_std::nullptr_t>::~Own
                    ((Own<kj::(anonymous_namespace)::HttpConnectionCloseEntityReader,_std::nullptr_t>
                      *)&_kjCondition);
          pAVar6 = extraout_RDX_05;
          goto LAB_00369204;
        }
LAB_00369024:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x88c,FAILED,(char *)0x0,"\"unknown transfer encoding\", te",
                   (char (*) [26])"unknown transfer encoding",&local_78);
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        lVar7 = *(long *)(in_R9 + 8);
        goto LAB_0036906c;
      }
      if (((((*local_78.content.ptr & 0xdfU) != 0x43) ||
           ((((byte *)local_78.content.ptr)[1] & 0xdf) != 0x48)) ||
          ((((byte *)local_78.content.ptr)[2] & 0xdf) != 0x55)) ||
         ((((((byte *)local_78.content.ptr)[3] & 0xdf) != 0x4e ||
           ((((byte *)local_78.content.ptr)[4] & 0xdf) != 0x4b)) ||
          (((((byte *)local_78.content.ptr)[5] & 0xdf) != 0x45 ||
           (((((byte *)local_78.content.ptr)[6] & 0xdf) != 0x44 ||
            (((byte *)local_78.content.ptr)[7] != 0)))))))) goto LAB_00369024;
      this_00 = (HttpEntityBodyReader *)operator_new(0x28);
      HttpEntityBodyReader::HttpEntityBodyReader(this_00,params_00);
      (this_00->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_0066cc38;
      this_00[1].super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
      *(undefined1 *)&this_00[1].weakInner.ptr = 1;
      pp_Var3 = (_func_int **)
                &kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityReader>::instance;
      pAVar6 = extraout_RDX;
    }
    (this->super_HttpInputStream)._vptr_HttpInputStream = pp_Var3;
    (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).
    currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)this_00;
  }
LAB_00369204:
  OVar9.ptr = pAVar6;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

kj::Own<kj::AsyncInputStream> HttpInputStreamImpl::getEntityBody(
    RequestOrResponse type,
    kj::OneOf<HttpMethod, HttpConnectMethod> method,
    uint statusCode,
    const kj::HttpHeaders& headers) {
  KJ_REQUIRE(headerBuffer.size() > 0, "Cannot get entity body after header buffer release.");

  auto isHeadRequest = method.tryGet<HttpMethod>().map([](auto& m) {
    return m == HttpMethod::HEAD;
  }).orDefault(false);

  auto isConnectRequest = method.is<HttpConnectMethod>();

  // Rules to determine how HTTP entity-body is delimited:
  //   https://tools.ietf.org/html/rfc7230#section-3.3.3
  // #1
  if (type == RESPONSE) {
    if (isHeadRequest) {
      // Body elided.
      kj::Maybe<uint64_t> length;
      KJ_IF_SOME(cl, headers.get(HttpHeaderId::CONTENT_LENGTH)) {
        length = strtoull(cl.cStr(), nullptr, 10);
      } else if (headers.get(HttpHeaderId::TRANSFER_ENCODING) == kj::none) {
        // HACK: Neither Content-Length nor Transfer-Encoding header in response to HEAD
        //   request. Propagate this fact with a 0 expected body length.
        length = uint64_t(0);
      }
      return kj::heap<HttpNullEntityReader>(*this, length);
    } else if (isConnectRequest && statusCode >= 200 && statusCode < 300) {
      KJ_FAIL_ASSERT("a CONNECT response with a 2xx status does not have an entity body to get");
    } else if (statusCode == 204 || statusCode == 304) {
      // No body.
      return kj::heap<HttpNullEntityReader>(*this, uint64_t(0));
    }
  }

  // For CONNECT requests messages, we let the rest of the logic play out.
  // We already check before here to ensure that Transfer-Encoding and
  // Content-Length headers are not present in which case the code below
  // does the right thing.

  // #3
  KJ_IF_SOME(te, headers.get(HttpHeaderId::TRANSFER_ENCODING)) {
    // TODO(someday): Support pluggable transfer encodings? Or at least gzip?
    // TODO(someday): Support stacked transfer encodings, e.g. "gzip, chunked".

    // NOTE: #3¶3 is ambiguous about what should happen if Transfer-Encoding and Content-Length are
    //   both present. It says that Transfer-Encoding takes precedence, but also that the request
    //   "ought to be handled as an error", and that proxies "MUST" drop the Content-Length before
    //   forwarding. We ignore the vague "ought to" part and implement the other two. (The
    //   dropping of Content-Length will happen naturally if/when the message is sent back out to
    //   the network.)
    if (fastCaseCmp<'c','h','u','n','k','e','d'>(te.cStr())) {
      // #3¶1
      return kj::heap<HttpChunkedEntityReader>(*this);
    } else if (fastCaseCmp<'i','d','e','n','t','i','t','y'>(te.cStr())) {
      // #3¶2
      KJ_REQUIRE(type != REQUEST, "request body cannot have Transfer-Encoding other than chunked");
      return kj::heap<HttpConnectionCloseEntityReader>(*this);
    }

    KJ_FAIL_REQUIRE("unknown transfer encoding", te) { break; };
  }

  // #4 and #5
  KJ_IF_SOME(cl, headers.get(HttpHeaderId::CONTENT_LENGTH)) {
    // NOTE: By spec, multiple Content-Length values are allowed as long as they are the same, e.g.
    //   "Content-Length: 5, 5, 5". Hopefully no one actually does that...
    char* end;
    uint64_t length = strtoull(cl.cStr(), &end, 10);
    if (end > cl.begin() && *end == '\0') {
      // #5
      return kj::heap<HttpFixedLengthEntityReader>(*this, length);
    } else {
      // #4 (bad content-length)
      KJ_FAIL_REQUIRE("invalid Content-Length header value", cl);
    }
  }

  // #6
  if (type == REQUEST) {
    // Lack of a Content-Length or Transfer-Encoding means no body for requests.
    return kj::heap<HttpNullEntityReader>(*this, uint64_t(0));
  }

  // RFC 2616 permitted "multipart/byteranges" responses to be self-delimiting, but this was
  // mercifully removed in RFC 7230, and new exceptions of this type are disallowed:
  //   https://www.w3.org/Protocols/rfc2616/rfc2616-sec4.html#sec4.4
  //   https://tools.ietf.org/html/rfc7230#page-81
  // To be extra-safe, we'll reject a multipart/byteranges response that lacks transfer-encoding
  // and content-length.
  KJ_IF_SOME(type, headers.get(HttpHeaderId::CONTENT_TYPE)) {
    if (type.startsWith("multipart/byteranges")) {
      KJ_FAIL_REQUIRE(
          "refusing to handle multipart/byteranges response without transfer-encoding nor "
          "content-length due to ambiguity between RFC 2616 vs RFC 7230.");
    }
  }

  // #7
  return kj::heap<HttpConnectionCloseEntityReader>(*this);
}